

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

bool __thiscall Jinx::Impl::Parser::ParseStatement(Parser *this)

{
  pointer pDVar1;
  SymbolListCItr endSymbol;
  pointer pFVar2;
  uint32_t uVar3;
  pointer pSVar4;
  RuntimeID id;
  Symbol *pSVar5;
  mapped_type *this_00;
  size_t sVar6;
  size_t address;
  SymbolList *pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  byte bVar10;
  bool bVar11;
  VisibilityType scope;
  Opcode opcode;
  char *pcVar12;
  byte bVar13;
  bool readOnly;
  bool bVar14;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  String name;
  FunctionMatch functionMatch;
  DebugLineEntry local_a8;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_90 [2];
  FunctionMatch local_40;
  
  if (this->m_error != false) {
    return false;
  }
  CheckFunctionCall(&local_40,this,false,(this->m_currentSymbol)._M_current,
                    (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish);
  if (local_40.signature != (FunctionSignature *)0x0) {
    ParseFunctionCall(this,&local_40);
    if (CommonData::globalParams.enableDebugInfo == true) {
      pDVar1 = (this->m_debugLines).
               super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->m_debugLines).
          super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
          ._M_impl.super__Vector_impl_data._M_start == pDVar1) {
        uVar3 = this->m_lastLine;
      }
      else {
        uVar3 = this->m_lastLine;
        if (pDVar1[-1].lineNumber == uVar3) goto LAB_001fec5a;
      }
      local_a0._4_4_ = uVar3;
      local_a0._0_4_ = (uint32_t)(this->m_writer).m_pos;
      std::
      vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
      ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,(DebugLineEntry *)local_a0);
    }
LAB_001fec5a:
    BinaryWriter::Write<Jinx::Impl::Opcode,unsigned_char>(&this->m_writer,Pop);
    if (((this->m_error == false) &&
        (pSVar4 = (this->m_currentSymbol)._M_current,
        pSVar4 != (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish)) && (pSVar4->type == NewLine)) {
      this->m_lastLine = pSVar4->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar4 + 1;
    }
    else {
      local_a0._0_8_ = CommonData::symbolTypeName[2];
      Error<char_const*>(this,"Expected symbol %s",(char **)local_a0);
    }
    bVar11 = false;
    goto LAB_001fee2a;
  }
  pcVar12 = "Unknown symbol in statement";
  if (this->m_error != false) goto LAB_001febc2;
  pSVar7 = this->m_symbolList;
  pSVar4 = (this->m_currentSymbol)._M_current;
  pSVar8 = (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  scope = Local;
  if ((pSVar4 == pSVar8) || (pSVar4->type != Set)) {
    bVar11 = false;
  }
  else {
    this->m_lastLine = pSVar4->lineNumber;
    pSVar4 = pSVar4 + 1;
    (this->m_currentSymbol)._M_current = pSVar4;
    pSVar8 = (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    bVar11 = true;
  }
  pSVar9 = pSVar4;
  if (pSVar4 == pSVar8) {
LAB_001fed1c:
    bVar14 = scope == Local;
    readOnly = false;
LAB_001fed25:
    if (pSVar4 != pSVar9) {
      if (pSVar4->type == Function) {
        this->m_lastLine = pSVar4->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar4 + 1;
        ParseFunctionDefinition(this,scope);
        goto LAB_001fee21;
      }
      if ((!bVar11) || (pSVar4->type != NameValue)) goto LAB_001fed8d;
      bVar11 = std::operator==(&pSVar4->text,
                               &((this->m_library).
                                 super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_name);
      if (bVar11) {
        pcVar12 = "Illegal use of library name in identifier";
        goto LAB_001fee6e;
      }
      if (bVar14) {
        bVar11 = CheckProperty(this,(this->m_currentSymbol)._M_current,(size_t *)0x0);
        if (bVar11) {
          ParsePropertyName((PropertyName *)local_a0,this);
          if ((bool)local_a0[0xc] == true) {
            Error<>(this,"Can\'t change readonly property");
            PropertyName::~PropertyName((PropertyName *)local_a0);
            goto LAB_001fee76;
          }
          uVar3 = ParseSubscriptSet(this);
          Expect(this,To,(char *)0x0);
          ParseExpression(this,(this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
          Expect(this,NewLine,(char *)0x0);
          if (uVar3 == 0) {
            EmitOpcode(this,SetProp);
          }
          else {
            EmitOpcode(this,SetPropKeyVal);
            EmitCount(this,uVar3);
          }
          EmitId(this,local_a0._0_8_);
          local_a8.opcodePosition = local_a0._0_4_;
          local_a8.lineNumber = local_a0._4_4_;
          this_00 = std::
                    map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                    ::operator[](&this->m_idNameMap,(key_type_conflict *)&local_a8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          _M_assign(this_00,local_90);
          PropertyName::~PropertyName((PropertyName *)local_a0);
        }
        else {
          local_a8.opcodePosition = 0x3f;
          local_a8.lineNumber = 0x14;
          symbols._M_len = 2;
          symbols._M_array = &local_a8.opcodePosition;
          ParseMultiName_abi_cxx11_((String *)local_a0,this,symbols);
          uVar3 = ParseSubscriptSet(this);
          Expect(this,To,(char *)0x0);
          ParseExpression(this,(this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
          Expect(this,NewLine,"Unable to parse expression");
          VariableAssign(this,(String *)local_a0);
          if (uVar3 == 0) {
            EmitOpcode(this,SetVar);
          }
          else {
            EmitOpcode(this,SetVarKeyVal);
            EmitCount(this,uVar3);
          }
          id = VariableNameToRuntimeID(this,(String *)local_a0);
          EmitId(this,id);
LAB_001ff052:
          if ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_a0._0_8_
              != local_90) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_destroy((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       local_a0,(size_type)local_90[0]._M_dataplus._M_p);
          }
        }
      }
      else {
        ParsePropertyDeclaration(this,scope,readOnly);
      }
LAB_001fee21:
      bVar10 = 1;
      goto LAB_001fee24;
    }
LAB_001fed8d:
    if (!bVar14) {
      local_a0._0_8_ = "private";
      if (scope == Public) {
        local_a0._0_8_ = "public";
      }
      Error<char_const*>(this,"Invalid symbol after scope specifier \'%s\'",(char **)local_a0);
      goto LAB_001fee21;
    }
    if (pSVar4 == pSVar9) goto LAB_001febc2;
    if (pSVar4->type != Begin) {
      if (pSVar4->type == If) {
        this->m_lastLine = pSVar4->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar4 + 1;
        ParseIfElse(this);
      }
      else if (pSVar4->type == Loop) {
        this->m_lastLine = pSVar4->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar4 + 1;
        ParseLoop(this);
      }
      else if (pSVar4->type == Erase) {
        this->m_lastLine = pSVar4->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar4 + 1;
        ParseErase(this);
      }
      else if ((pSVar4->type == Increment) || (pSVar4->type == Decrement)) {
        ParseIncDec(this);
      }
      else {
        if (pSVar4->type == Return) {
          this->m_lastLine = pSVar4->lineNumber;
          pSVar5 = pSVar4 + 1;
          (this->m_currentSymbol)._M_current = pSVar5;
          endSymbol._M_current =
               (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if ((long)(this->m_variableStackFrame).m_frames.
                    super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_variableStackFrame).m_frames.
                    super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x20) {
            if ((pSVar5 == endSymbol._M_current) || (pSVar5->type != NewLine)) {
              LogWriteLine(Warning,"Return values at root scope do nothing");
              ParseExpression(this,(this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish);
            }
            EmitOpcode(this,Exit);
          }
          else {
            if ((pSVar5 == endSymbol._M_current) || (pSVar5->type != NewLine)) {
              ParseExpression(this,endSymbol);
            }
            else {
              EmitOpcode(this,PushVal);
              local_a0._0_8_ = local_a0._0_8_ & 0xffffffff00000000;
              Variant::Destroy((Variant *)local_a0);
              local_a0._0_8_ = local_a0._0_8_ & 0xffffffff00000000;
              Variant::Write((Variant *)local_a0,&this->m_writer);
              Variant::Destroy((Variant *)local_a0);
            }
            EmitOpcode(this,Return);
          }
          bVar10 = 1;
          if (((this->m_error == false) &&
              (pSVar4 = (this->m_currentSymbol)._M_current,
              pSVar4 != (this->m_symbolList->
                        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                        )._M_impl.super__Vector_impl_data._M_finish)) && (pSVar4->type == NewLine))
          {
            this->m_lastLine = pSVar4->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar4 + 1;
          }
          bVar13 = 1;
          goto LAB_001fee27;
        }
        if (pSVar4->type == Break) {
          this->m_lastLine = pSVar4->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar4 + 1;
          Expect(this,NewLine,(char *)0x0);
          EmitOpcode(this,Jump);
          sVar6 = EmitAddressPlaceholder(this);
          this->m_breakAddress = sVar6;
        }
        else {
          if (pSVar4->type == Wait) {
            this->m_lastLine = pSVar4->lineNumber;
            pSVar8 = pSVar4 + 1;
            (this->m_currentSymbol)._M_current = pSVar8;
            pcVar12 = "Unexpected symbol after wait";
            if (pSVar8 != (pSVar7->
                          super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
              if (pSVar8->type == NewLine) {
                this->m_lastLine = pSVar4[1].lineNumber;
                (this->m_currentSymbol)._M_current = pSVar4 + 2;
                EmitOpcode(this,Wait);
              }
              else {
                if (pSVar8->type == Until) {
                  sVar6 = (this->m_writer).m_pos;
                  this->m_lastLine = pSVar4[1].lineNumber;
                  (this->m_currentSymbol)._M_current = pSVar4 + 2;
                  opcode = JumpTrue;
                }
                else {
                  if (pSVar8->type != While) goto LAB_001febc2;
                  sVar6 = (this->m_writer).m_pos;
                  Expect(this,While,(char *)0x0);
                  pSVar7 = this->m_symbolList;
                  opcode = JumpFalse;
                }
                ParseExpression(this,(pSVar7->
                                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                     )._M_impl.super__Vector_impl_data._M_finish);
                bVar11 = Expect(this,NewLine,(char *)0x0);
                if (!bVar11) goto LAB_001fee76;
                EmitOpcode(this,opcode);
                address = EmitAddressPlaceholder(this);
                EmitOpcode(this,Wait);
                EmitOpcode(this,Jump);
                EmitAddress(this,sVar6);
                EmitAddressBackfill(this,address);
              }
              goto LAB_001fee21;
            }
          }
          else if (pSVar4->type == External) {
            this->m_lastLine = pSVar4->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar4 + 1;
            bVar11 = CheckProperty(this,pSVar4 + 1,(size_t *)0x0);
            ParseMultiName_abi_cxx11_
                      ((String *)local_a0,this,(initializer_list<Jinx::Impl::SymbolType>)ZEXT816(0))
            ;
            pFVar2 = (this->m_variableStackFrame).m_frames.
                     super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((long)pFVar2 -
                (long)(this->m_variableStackFrame).m_frames.
                      super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x20) {
              if ((long)pFVar2[-1].stack.
                        super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)pFVar2[-1].stack.
                        super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x30) {
                if (bVar11) {
                  local_a8.opcodePosition = local_a0._0_4_;
                  local_a8.lineNumber = local_a0._4_4_;
                  Error<char_const*>(this,"External variable \'%s\' is already a property name",
                                     (char **)&local_a8);
                }
                else {
                  bVar11 = VariableStackFrame::VariableExists
                                     (&this->m_variableStackFrame,(String *)local_a0);
                  if (bVar11) {
                    local_a8.opcodePosition = local_a0._0_4_;
                    local_a8.lineNumber = local_a0._4_4_;
                    Error<char_const*>(this,"Variable \'%s\' already exists",(char **)&local_a8);
                  }
                  else {
                    bVar11 = VariableStackFrame::VariableAssign
                                       (&this->m_variableStackFrame,(String *)local_a0);
                    if (!bVar11) {
                      local_a8.opcodePosition = local_a0._0_4_;
                      local_a8.lineNumber = local_a0._4_4_;
                      Error<char_const*>(this,"Error creating external variable \'%s\'",
                                         (char **)&local_a8);
                    }
                  }
                }
              }
              else {
                local_a8.opcodePosition = local_a0._0_4_;
                local_a8.lineNumber = local_a0._4_4_;
                Error<char_const*>(this,
                                   "External variable \'%s\' must be declared at the root scope",
                                   (char **)&local_a8);
              }
            }
            else {
              local_a8.opcodePosition = local_a0._0_4_;
              local_a8.lineNumber = local_a0._4_4_;
              Error<char_const*>(this,"External variable \'%s\' can\'t be declared in a function",
                                 (char **)&local_a8);
            }
            Expect(this,NewLine,(char *)0x0);
            goto LAB_001ff052;
          }
LAB_001febc2:
          Error<>(this,pcVar12);
        }
      }
      goto LAB_001fee21;
    }
    this->m_lastLine = pSVar4->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar4 + 1;
    Expect(this,NewLine,(char *)0x0);
    ParseBlock(this);
    Expect(this,End,(char *)0x0);
    bVar13 = 0;
    Expect(this,NewLine,(char *)0x0);
    bVar10 = 1;
  }
  else {
    if (pSVar4->type == Private) {
      scope = Private;
LAB_001fecd2:
      this->m_lastLine = pSVar4->lineNumber;
      pSVar4 = pSVar4 + 1;
      (this->m_currentSymbol)._M_current = pSVar4;
      pSVar8 = (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      scope = Local;
      if (pSVar4->type == Public) {
        scope = Public;
        goto LAB_001fecd2;
      }
    }
    pSVar9 = pSVar8;
    if ((pSVar4 == pSVar8) || (pSVar4->type != Readonly)) goto LAB_001fed1c;
    this->m_lastLine = pSVar4->lineNumber;
    pSVar4 = pSVar4 + 1;
    (this->m_currentSymbol)._M_current = pSVar4;
    if (scope != Local) {
      pSVar9 = (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      readOnly = true;
      bVar14 = false;
      goto LAB_001fed25;
    }
    pcVar12 = "The \'readonly\' keyword must follow a private or public keyword";
LAB_001fee6e:
    Error<>(this,pcVar12);
LAB_001fee76:
    bVar10 = 0;
LAB_001fee24:
    bVar13 = 0;
  }
LAB_001fee27:
  bVar11 = (bool)(bVar10 & bVar13);
LAB_001fee2a:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&local_40.partData.
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 );
  return bVar11;
}

Assistant:

inline bool Parser::ParseStatement()
	{
		// No need to continue if an error has been flagged
		if (m_error)
			return false;

		bool returnedValue = false;

		// Functions signatures have precedence over everything, so check for a 
		// potential signature match before anything else.
		const auto functionMatch = CheckFunctionCall();
		if (functionMatch.signature)
		{
			// We found a valid function signature that matches the current token(s)
			ParseFunctionCall(functionMatch);

			// Since all functions return a value, we need to discard the return
			// value not on the stack, since we're not assigning it to a variable.
			EmitOpcode(Opcode::Pop);
			Expect(SymbolType::NewLine);
		}
		else
		{
			bool set = Accept(SymbolType::Set);

			// Parse scope level
			VisibilityType scope = ParseScope();

			// Parse optional readonly, which can only apply to properties
			bool readOnly = Accept(SymbolType::Readonly);
			if (readOnly)
			{
				if (scope == VisibilityType::Local)
				{
					Error("The 'readonly' keyword must follow a private or public keyword");
					return false;
				}
			}

			if (Accept(SymbolType::Function))
			{
				// We're parsing a function definition
				ParseFunctionDefinition(scope);
			}
			else if (set && CheckName())
			{
				// Can't use the current library name or preface the variable with it
				if (m_currentSymbol->text == m_library->GetName())
				{
					Error("Illegal use of library name in identifier");
					return false;
				}

				// We're declaring a new property if we see a non-local scope declaration
				if (scope != VisibilityType::Local)
				{
					ParsePropertyDeclaration(scope, readOnly);
				}
				// Either this is an existing property or a variable
				else
				{
					// Check to see if this is an existing property
					if (CheckProperty())
					{
						// Get the property name
						auto propertyName = ParsePropertyName();

						// Make sure we're not trying to assign a value to a readonly property
						if (propertyName.IsReadOnly())
						{
							Error("Can't change readonly property");
							return false;
						}

						// Check for subscript operators
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine);

						// Assign property
						if (subscripts)
						{
							EmitOpcode(Opcode::SetPropKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetProp);

						EmitId(propertyName.GetId());
						m_idNameMap[propertyName.GetId()] = propertyName.GetName();
					}
					// Otherwise we're just dealing with an ordinary variable
					else
					{
						// Get the variable name
						String name = ParseMultiName({ SymbolType::To, SymbolType::SquareOpen });

						// Check for subscript operator
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine, "Unable to parse expression");

						// Add to variable table
						VariableAssign(name);

						// Assign a variable. 
						if (subscripts)
						{
							EmitOpcode(Opcode::SetVarKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetVar);
						EmitId(VariableNameToRuntimeID(name));
					}
				}
			}
			else if (scope == VisibilityType::Local)
			{
				if (Accept(SymbolType::Begin))
				{
					// We're parsing a begin/end block
					Expect(SymbolType::NewLine);
					ParseBlock();
					Expect(SymbolType::End);
					Expect(SymbolType::NewLine);
				}
				else if (Accept(SymbolType::If))
				{
					// We're parsing an if or if/else block
					ParseIfElse();
				}
				else if (Accept(SymbolType::Loop))
				{
					// We're parsing a loop block
					ParseLoop();
				}
				else if (Accept(SymbolType::Erase))
				{
					// We're parsing an erase operation
					ParseErase();
				}
				else if (Check(SymbolType::Increment) || Check(SymbolType::Decrement))
				{
					// We're parsing an increment or decrement statement
					ParseIncDec();
				}
				else if (Accept(SymbolType::Return))
				{
					// We've hit a return value.  There are different behaviors depending whether or
					// not we're at the base scope or not.
					if (m_variableStackFrame.IsRootFrame())
					{
						if (!Check(SymbolType::NewLine))
						{
							LogWriteLine(LogLevel::Warning, "Return values at root scope do nothing");
							ParseExpression();
						}
						EmitOpcode(Opcode::Exit);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
					else
					{
						if (!Check(SymbolType::NewLine))
						{
							ParseExpression();
						}
						else
						{
							EmitOpcode(Opcode::PushVal);
							EmitValue(nullptr);
						}
						EmitOpcode(Opcode::Return);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
				}
				else if (Accept(SymbolType::Break))
				{
					// We've hit a break statement
					Expect(SymbolType::NewLine);
					EmitOpcode(Opcode::Jump);
					m_breakAddress = EmitAddressPlaceholder();
				}
				else if (Accept(SymbolType::Wait))
				{
					// Check for basic wait statement
					if (Accept(SymbolType::NewLine))
						EmitOpcode(Opcode::Wait);
					else if (Check(SymbolType::Until) || Check(SymbolType::While))
					{
						// Store expression address
						auto expressionAddress = m_writer.Tell();

						// Check which keyword was used
						bool jumpTrue = Accept(SymbolType::Until);
						if (!jumpTrue)
							Expect(SymbolType::While);

						// Parse the expression to check for wait
						ParseExpression();
						if (!Expect(SymbolType::NewLine))
							return false;

						// Add jump if false/true over wait statement depending on keyword
						EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);

						// Mark placeholder for later jump address insertion
						auto addressPlaceholder = EmitAddressPlaceholder();

						// Wait statement is executed if expression is true
						EmitOpcode(Opcode::Wait);
						EmitOpcode(Opcode::Jump);
						EmitAddress(expressionAddress);

						// Backfill placeholder at end of conditional wait statement
						EmitAddressBackfill(addressPlaceholder);
					}
					else
					{
						Error("Unexpected symbol after wait");
					}
				}
				else if (Accept(SymbolType::External))
				{
					// First check to see if this collides with an existing property name
					bool propExists = CheckProperty();

					// Get the variable name
					String name = ParseMultiName({ });

					// Validate the name is legal and register it as a variable name
					if (!m_variableStackFrame.IsRootFrame())
						Error("External variable '%s' can't be declared in a function", name.c_str());
					else if (!m_variableStackFrame.IsRootScope())
						Error("External variable '%s' must be declared at the root scope", name.c_str());
					else if (propExists)
						Error("External variable '%s' is already a property name", name.c_str());
					else if (m_variableStackFrame.VariableExists(name))
						Error("Variable '%s' already exists", name.c_str());
					else if (!m_variableStackFrame.VariableAssign(name))
						Error("Error creating external variable '%s'", name.c_str());

					Expect(SymbolType::NewLine);
				}
				else
				{
					Error("Unknown symbol in statement");
				}
			}
			else
			{
				Error("Invalid symbol after scope specifier '%s'", scope == VisibilityType::Public ? "public" : "private");
			}
		}

		// This is not an error value, but signals whether we've returned a value from this statement
		return returnedValue;
	}